

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_device_init__null(ma_context *pContext,ma_device_config *pConfig,ma_device *pDevice)

{
  ma_uint32 local_30;
  ma_uint32 periodSizeInFrames;
  ma_result result;
  ma_device *pDevice_local;
  ma_device_config *pConfig_local;
  ma_context *pContext_local;
  
  if (pDevice == (ma_device *)0x0) {
    __assert_fail("pDevice != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x2505,
                  "ma_result ma_device_init__null(ma_context *, const ma_device_config *, ma_device *)"
                 );
  }
  memset(&pDevice->field_23,0,0x110);
  if (pConfig->deviceType == ma_device_type_loopback) {
    pContext_local._4_4_ = -0x65;
  }
  else {
    local_30 = pConfig->periodSizeInFrames;
    if (local_30 == 0) {
      local_30 = ma_calculate_buffer_size_in_frames_from_milliseconds
                           (pConfig->periodSizeInMilliseconds,pConfig->sampleRate);
    }
    if ((pConfig->deviceType == ma_device_type_capture) ||
       (pConfig->deviceType == ma_device_type_duplex)) {
      ma_strncpy_s((pDevice->capture).name,0x100,"NULL Capture Device",0xffffffffffffffff);
      (pDevice->capture).internalFormat = (pConfig->capture).format;
      (pDevice->capture).internalChannels = (pConfig->capture).channels;
      ma_channel_map_copy((pDevice->capture).internalChannelMap,(pConfig->capture).channelMap,
                          (pConfig->capture).channels);
      (pDevice->capture).internalPeriodSizeInFrames = local_30;
      (pDevice->capture).internalPeriods = pConfig->periods;
    }
    if ((pConfig->deviceType == ma_device_type_playback) ||
       (pConfig->deviceType == ma_device_type_duplex)) {
      ma_strncpy_s((pDevice->playback).name,0x100,"NULL Playback Device",0xffffffffffffffff);
      (pDevice->playback).internalFormat = (pConfig->playback).format;
      (pDevice->playback).internalChannels = (pConfig->playback).channels;
      ma_channel_map_copy((pDevice->playback).internalChannelMap,(pConfig->playback).channelMap,
                          (pConfig->playback).channels);
      (pDevice->playback).internalPeriodSizeInFrames = local_30;
      (pDevice->playback).internalPeriods = pConfig->periods;
    }
    pContext_local._4_4_ = ma_event_init(pContext,&(pDevice->field_23).null_device.operationEvent);
    if (((pContext_local._4_4_ == 0) &&
        (pContext_local._4_4_ =
              ma_event_init(pContext,&(pDevice->field_23).null_device.operationCompletionEvent),
        pContext_local._4_4_ == 0)) &&
       (pContext_local._4_4_ =
             ma_thread_create(pContext,&pDevice->thread,ma_device_thread__null,pDevice),
       pContext_local._4_4_ == 0)) {
      pContext_local._4_4_ = 0;
    }
  }
  return pContext_local._4_4_;
}

Assistant:

static ma_result ma_device_init__null(ma_context* pContext, const ma_device_config* pConfig, ma_device* pDevice)
{
    ma_result result;
    ma_uint32 periodSizeInFrames;

    MA_ASSERT(pDevice != NULL);

    MA_ZERO_OBJECT(&pDevice->null_device);

    if (pConfig->deviceType == ma_device_type_loopback) {
        return MA_DEVICE_TYPE_NOT_SUPPORTED;
    }

    periodSizeInFrames = pConfig->periodSizeInFrames;
    if (periodSizeInFrames == 0) {
        periodSizeInFrames = ma_calculate_buffer_size_in_frames_from_milliseconds(pConfig->periodSizeInMilliseconds, pConfig->sampleRate);
    }

    if (pConfig->deviceType == ma_device_type_capture || pConfig->deviceType == ma_device_type_duplex) {
        ma_strncpy_s(pDevice->capture.name,  sizeof(pDevice->capture.name),  "NULL Capture Device",  (size_t)-1);
        pDevice->capture.internalFormat             = pConfig->capture.format;
        pDevice->capture.internalChannels           = pConfig->capture.channels;
        ma_channel_map_copy(pDevice->capture.internalChannelMap, pConfig->capture.channelMap, pConfig->capture.channels);
        pDevice->capture.internalPeriodSizeInFrames = periodSizeInFrames;
        pDevice->capture.internalPeriods            = pConfig->periods;
    }
    if (pConfig->deviceType == ma_device_type_playback || pConfig->deviceType == ma_device_type_duplex) {
        ma_strncpy_s(pDevice->playback.name, sizeof(pDevice->playback.name), "NULL Playback Device", (size_t)-1);
        pDevice->playback.internalFormat             = pConfig->playback.format;
        pDevice->playback.internalChannels           = pConfig->playback.channels;
        ma_channel_map_copy(pDevice->playback.internalChannelMap, pConfig->playback.channelMap, pConfig->playback.channels);
        pDevice->playback.internalPeriodSizeInFrames = periodSizeInFrames;
        pDevice->playback.internalPeriods            = pConfig->periods;
    }

    /*
    In order to get timing right, we need to create a thread that does nothing but keeps track of the timer. This timer is started when the
    first period is "written" to it, and then stopped in ma_device_stop__null().
    */
    result = ma_event_init(pContext, &pDevice->null_device.operationEvent);
    if (result != MA_SUCCESS) {
        return result;
    }

    result = ma_event_init(pContext, &pDevice->null_device.operationCompletionEvent);
    if (result != MA_SUCCESS) {
        return result;
    }

    result = ma_thread_create(pContext, &pDevice->thread, ma_device_thread__null, pDevice);
    if (result != MA_SUCCESS) {
        return result;
    }

    return MA_SUCCESS;
}